

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuconnection.cpp
# Opt level: O3

bool __thiscall QDBusMenuConnection::registerTrayIcon(QDBusMenuConnection *this,QDBusTrayIcon *item)

{
  QArrayData *pQVar1;
  QDebug this_00;
  char cVar2;
  bool bVar3;
  QString *item_00;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  QDebug local_48;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusConnection::QDBusConnection((QDBusConnection *)&local_68,(QDBusConnection *)(this + 0x28));
  item_00 = &StatusNotifierItemPath;
  cVar2 = QDBusConnection::registerObject(&local_68,&StatusNotifierItemPath,item,1);
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_68);
  if (cVar2 == '\0') {
    unregisterTrayIcon(this,item);
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = "default";
    QMessageLogger::warning();
    this_00.stream = local_48.stream;
    QVar5.m_data = (storage_type *)0x12;
    QVar5.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if ((local_48.stream)->space == true) {
      QTextStream::operator<<(&(local_48.stream)->ts,' ');
    }
    pQVar1 = &((item->m_instanceId).d.d)->super_QArrayData;
    pcVar4 = (item->m_instanceId).d.ptr;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_48,(ulong)pcVar4);
    if ((local_48.stream)->space == true) {
      QTextStream::operator<<(&(local_48.stream)->ts,' ');
    }
    pcVar4 = StatusNotifierItemPath.d.ptr;
    if (StatusNotifierItemPath.d.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_48,(ulong)pcVar4);
    if ((local_48.stream)->space == true) {
      QTextStream::operator<<(&(local_48.stream)->ts,' ');
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    QDebug::~QDebug(&local_48);
    bVar3 = false;
  }
  else {
    if (item->m_menu != (QDBusPlatformMenu *)0x0) {
      registerTrayIconMenu(this,item);
      item_00 = (QString *)item;
    }
    bVar3 = registerTrayIconWithWatcher(this,(QDBusTrayIcon *)item_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusMenuConnection::registerTrayIcon(QDBusTrayIcon *item)
{
    bool success = connection().registerObject(StatusNotifierItemPath, item);
    if (!success) {
        unregisterTrayIcon(item);
        qWarning() << "failed to register" << item->instanceId() << StatusNotifierItemPath;
        return false;
    }

    if (item->menu())
        registerTrayIconMenu(item);

    return registerTrayIconWithWatcher(item);
}